

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Feature.cpp
# Opt level: O0

void __thiscall jbcoin::detail::FeatureCollections::FeatureCollections(FeatureCollections *this)

{
  size_t sVar1;
  char *pcVar2;
  size_t size;
  mapped_type *pmVar3;
  mapped_type *this_00;
  allocator local_149;
  key_type local_148;
  undefined1 local_128 [8];
  uint256 f;
  sha512_half_hasher h;
  char *name;
  size_t i;
  FeatureCollections *this_local;
  
  std::vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
  vector(&this->features);
  boost::container::
  flat_map<jbcoin::base_uint<256UL,_void>,_unsigned_long,_std::less<jbcoin::base_uint<256UL,_void>_>,_void>
  ::flat_map(&this->featureToIndex);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::flat_map(&this->nameToFeature);
  sVar1 = numFeatures();
  std::vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
  reserve(&this->features,sVar1);
  sVar1 = numFeatures();
  boost::container::
  flat_map<jbcoin::base_uint<256UL,_void>,_unsigned_long,_std::less<jbcoin::base_uint<256UL,_void>_>,_void>
  ::reserve(&this->featureToIndex,sVar1);
  sVar1 = numFeatures();
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::reserve(&this->nameToFeature,sVar1);
  name = (char *)0x0;
  while( true ) {
    pcVar2 = (char *)numFeatures();
    if (pcVar2 <= name) break;
    pcVar2 = *(char **)(featureNames + (long)name * 8);
    basic_sha512_half_hasher<false>::basic_sha512_half_hasher
              ((basic_sha512_half_hasher<false> *)(f.pn + 6));
    size = strlen(pcVar2);
    basic_sha512_half_hasher<false>::operator()
              ((basic_sha512_half_hasher<false> *)(f.pn + 6),pcVar2,size);
    basic_sha512_half_hasher::operator_cast_to_base_uint
              ((result_type *)local_128,(basic_sha512_half_hasher *)(f.pn + 6));
    std::vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
    push_back(&this->features,(result_type *)local_128);
    pmVar3 = boost::container::
             flat_map<jbcoin::base_uint<256UL,_void>,_unsigned_long,_std::less<jbcoin::base_uint<256UL,_void>_>,_void>
             ::operator[](&this->featureToIndex,(key_type *)local_128);
    *pmVar3 = (mapped_type)name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,pcVar2,&local_149);
    this_00 = boost::container::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
              ::operator[](&this->nameToFeature,&local_148);
    base_uint<256UL,_void>::operator=(this_00,(base_uint<256UL,_void> *)local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    basic_sha512_half_hasher<false>::~basic_sha512_half_hasher
              ((basic_sha512_half_hasher<false> *)(f.pn + 6));
    name = name + 1;
  }
  return;
}

Assistant:

detail::FeatureCollections::FeatureCollections()
{
    features.reserve(numFeatures());
    featureToIndex.reserve(numFeatures());
    nameToFeature.reserve(numFeatures());

    for (std::size_t i = 0; i < numFeatures(); ++i)
    {
        auto const name = featureNames[i];
        sha512_half_hasher h;
        h (name, std::strlen (name));
        auto const f = static_cast<uint256>(h);

        features.push_back(f);
        featureToIndex[f] = i;
        nameToFeature[name] = f;
    }
}